

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_tvp.c
# Opt level: O1

int jas_tvparser_next(jas_tvparser_t *tvp)

{
  byte bVar1;
  ushort *puVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  bool bVar8;
  
  pcVar7 = tvp->pos;
  cVar6 = *pcVar7;
  bVar8 = (long)cVar6 == 0;
  if (!bVar8) {
    ppuVar3 = __ctype_b_loc();
    bVar1 = *(byte *)((long)*ppuVar3 + (long)cVar6 * 2 + 1);
    while ((bVar1 & 0x20) != 0) {
      pcVar7 = pcVar7 + 1;
      cVar6 = *pcVar7;
      bVar8 = (long)cVar6 == 0;
      if (bVar8) goto LAB_001146c7;
      bVar1 = *(byte *)((long)*ppuVar3 + (long)cVar6 * 2 + 1);
    }
    if (!bVar8) {
      ppuVar3 = __ctype_b_loc();
      puVar2 = *ppuVar3;
      if ((cVar6 != '_') && ((puVar2[cVar6] & 0xc00) == 0)) {
        return -1;
      }
      cVar6 = *pcVar7;
      pcVar5 = pcVar7;
      if (cVar6 != '\0') {
        pcVar5 = pcVar7 + 1;
        do {
          if ((cVar6 != '_') && ((puVar2[cVar6] & 0xc00) == 0)) {
            if (cVar6 == '=') {
              pcVar5[-1] = '\0';
              bVar8 = (long)*pcVar5 == 0;
              pcVar4 = pcVar5;
              if (bVar8) goto LAB_001147aa;
              bVar1 = *(byte *)((long)*ppuVar3 + (long)*pcVar5 * 2 + 1);
              goto joined_r0x0011477f;
            }
            if (cVar6 != '\0') {
              if ((*(byte *)((long)puVar2 + (long)cVar6 * 2 + 1) & 0x20) == 0) {
                return -1;
              }
              pcVar5[-1] = '\0';
              goto LAB_00114746;
            }
            break;
          }
          cVar6 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while (cVar6 != '\0');
        pcVar5 = pcVar5 + -1;
      }
LAB_00114746:
      tvp->tag = pcVar7;
      tvp->val = "";
      tvp->pos = pcVar5;
      return 0;
    }
  }
LAB_001146c7:
  tvp->pos = pcVar7;
  return 1;
joined_r0x0011477f:
  if ((bVar1 & 0x20) != 0) {
    if (!bVar8) {
      *pcVar4 = '\0';
      pcVar4 = pcVar4 + 1;
    }
LAB_001147aa:
    tvp->pos = pcVar4;
    tvp->tag = pcVar7;
    tvp->val = pcVar5;
    return 0;
  }
  pcVar4 = pcVar4 + 1;
  bVar8 = (long)*pcVar4 == 0;
  if (bVar8) goto LAB_001147aa;
  bVar1 = *(byte *)((long)*ppuVar3 + (long)*pcVar4 * 2 + 1);
  goto joined_r0x0011477f;
}

Assistant:

int jas_tvparser_next(jas_tvparser_t *tvp)
{
	char *p;
	char *tag;
	char *val;

	/* Skip any leading whitespace. */
	p = tvp->pos;
	while (*p != '\0' && isspace(*p)) {
		++p;
	}

	/* Has the end of the input data been reached? */
	if (*p == '\0') {
		/* No more tags are present. */
		tvp->pos = p;
		return 1;
	}

	/* Does the tag name begin with a valid character? */
	if (!JAS_TVP_ISTAG(*p)) {
		return -1;
	}

	/* Remember where the tag name begins. */
	tag = p;

	/* Find the end of the tag name. */
	while (*p != '\0' && JAS_TVP_ISTAG(*p)) {
		++p;
	}

	/* Has the end of the input data been reached? */
	if (*p == '\0') {
		/* The value field is empty. */
		tvp->tag = tag;
		tvp->val = "";
		tvp->pos = p;
		return 0;
	}

	/* Is a value field not present? */
	if (*p != '=') {
		if (*p != '\0' && !isspace(*p)) {
			return -1;
		}
		*p++ = '\0';
		tvp->tag = tag;
		tvp->val = "";
		tvp->pos = p;
		return 0;
	}

	*p++ = '\0';

	val = p;
	while (*p != '\0' && !isspace(*p)) {
		++p;
	}

	if (*p != '\0') {
		*p++ = '\0';
	}

	tvp->pos = p;
	tvp->tag = tag;
	tvp->val = val;

	return 0;
}